

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void write_file_u32(vector<unsigned_int,_std::allocator<unsigned_int>_> *nums,string *file_name)

{
  FILE *pFVar1;
  FILE *f_00;
  size_type sVar2;
  size_t sVar3;
  string *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  size_t ret;
  FILE *f;
  char *in_stack_ffffffffffffff98;
  size_t sVar4;
  string *file_name_00;
  string local_38;
  FILE *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  file_name_00 = &local_38;
  local_8 = in_RDI;
  std::__cxx11::string::string((string *)file_name_00,in_RSI);
  pFVar1 = (FILE *)fopen_or_fail(file_name_00,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&local_38);
  local_18 = pFVar1;
  f_00 = (FILE *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x176dd3);
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  sVar3 = fwrite(f_00,4,sVar2,local_18);
  sVar4 = sVar3;
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_8);
  if (sVar4 != sVar2) {
    quit("reading file content failed: %d",sVar3);
  }
  fclose_or_fail(f_00);
  return;
}

Assistant:

void write_file_u32(std::vector<uint32_t>& nums, std::string file_name)
{
    auto f = fopen_or_fail(file_name, "wb");
    auto ret = fwrite(nums.data(), sizeof(uint32_t), nums.size(), f);
    if (ret != nums.size()) {
        quit("reading file content failed: %d", ret);
    }
    fclose_or_fail(f);
}